

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGParameters.h
# Opt level: O2

bool __thiscall
dg::DGParameters<dg::LLVMNode>::add
          (DGParameters<dg::LLVMNode> *this,KeyT k,LLVMNode *val_in,LLVMNode *val_out,
          ContainerType *C)

{
  pair<std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::DGParameterPair<dg::LLVMNode>_>_>,_bool>
  pVar1;
  pair<llvm::Value_*,_dg::DGParameterPair<dg::LLVMNode>_> local_38;
  
  local_38.first = k;
  local_38.second.in = val_in;
  local_38.second.out = val_out;
  pVar1 = std::
          _Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>,std::_Select1st<std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>>>
          ::_M_emplace_unique<std::pair<llvm::Value*,dg::DGParameterPair<dg::LLVMNode>>&>
                    ((_Rb_tree<llvm::Value*,std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>,std::_Select1st<std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>>,std::less<llvm::Value*>,std::allocator<std::pair<llvm::Value*const,dg::DGParameterPair<dg::LLVMNode>>>>
                      *)C,&local_38);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    BBlock<dg::LLVMNode>::append(this->BBIn,val_in);
    BBlock<dg::LLVMNode>::append(this->BBOut,val_out);
  }
  return (bool)(pVar1.second & 1);
}

Assistant:

bool add(KeyT k, NodeT *val_in, NodeT *val_out, ContainerType *C) {
        auto v = std::make_pair(k, DGParameterPair<NodeT>(val_in, val_out));
        if (!C->insert(v).second)
            // we already has param with this key
            return false;

        BBIn->append(val_in);
        BBOut->append(val_out);

        return true;
    }